

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void kratos::remove_stmt_from_parent(shared_ptr<kratos::Stmt> *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  int iVar1;
  IRNodeKind IVar2;
  StatementType SVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  StmtException *pSVar5;
  InternalException *pIVar6;
  long *local_228;
  long *local_1f0;
  long *local_1d0;
  SwitchStmt *local_1c0;
  Generator *local_198;
  allocator<char> local_181;
  string local_180;
  long *local_160;
  StmtBlock *p_3;
  element_type *local_150;
  element_type **local_148;
  size_type local_140;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_138;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0;
  long *local_d0;
  IfStmt *p_2;
  string local_c0;
  long *local_a0;
  SwitchStmt *p_1;
  Stmt *p_stmt;
  element_type *local_88;
  element_type **local_80;
  size_type local_78;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_70;
  allocator<char> local_41;
  string local_40;
  Generator *local_20;
  Generator *p;
  IRNode *parent;
  shared_ptr<kratos::Stmt> *stmt_local;
  
  parent = (IRNode *)stmt;
  peVar4 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )stmt);
  iVar1 = (*(peVar4->super_IRNode)._vptr_IRNode[4])();
  p = (Generator *)CONCAT44(extraout_var,iVar1);
  if (p != (Generator *)0x0) {
    IVar2 = IRNode::ir_node_kind((IRNode *)p);
    if (IVar2 == GeneratorKind) {
      if (p == (Generator *)0x0) {
        local_198 = (Generator *)0x0;
      }
      else {
        local_198 = (Generator *)__dynamic_cast(p,&IRNode::typeinfo,&Generator::typeinfo,0);
      }
      local_20 = local_198;
      Generator::remove_stmt(local_198,(shared_ptr<kratos::Stmt> *)parent);
    }
    else {
      IVar2 = IRNode::ir_node_kind(&p->super_IRNode);
      if (IVar2 != StmtKind) {
        p_stmt._6_1_ = 1;
        pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Internal error",&local_41);
        local_88 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)parent);
        local_80 = &local_88;
        local_78 = 1;
        std::allocator<kratos::IRNode_*>::allocator
                  ((allocator<kratos::IRNode_*> *)((long)&p_stmt + 7));
        __l_00._M_len = local_78;
        __l_00._M_array = (iterator)local_80;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_70,__l_00,(allocator<kratos::IRNode_*> *)((long)&p_stmt + 7));
        StmtException::StmtException(pSVar5,&local_40,&local_70);
        p_stmt._6_1_ = 0;
        __cxa_throw(pSVar5,&StmtException::typeinfo,StmtException::~StmtException);
      }
      if (p == (Generator *)0x0) {
        local_1c0 = (SwitchStmt *)0x0;
      }
      else {
        local_1c0 = (SwitchStmt *)__dynamic_cast(p,&IRNode::typeinfo,&Stmt::typeinfo,0);
      }
      p_1 = local_1c0;
      SVar3 = Stmt::type(&local_1c0->super_Stmt);
      if (SVar3 == Switch) {
        if (p_1 == (SwitchStmt *)0x0) {
          local_1d0 = (long *)0x0;
        }
        else {
          local_1d0 = (long *)__dynamic_cast(p_1,&Stmt::typeinfo,&SwitchStmt::typeinfo,0);
        }
        local_a0 = local_1d0;
        if (local_1d0 == (long *)0x0) {
          p_2._6_1_ = 1;
          pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"stmt is not switch but is marked as StatementType::Switch"
                     ,(allocator<char> *)((long)&p_2 + 7));
          InternalException::InternalException(pIVar6,&local_c0);
          p_2._6_1_ = 0;
          __cxa_throw(pIVar6,&InternalException::typeinfo,InternalException::~InternalException);
        }
        (**(code **)(*local_1d0 + 0x50))(local_1d0,parent);
      }
      else {
        SVar3 = Stmt::type(&p_1->super_Stmt);
        if (SVar3 == If) {
          if (p_1 == (SwitchStmt *)0x0) {
            local_1f0 = (long *)0x0;
          }
          else {
            local_1f0 = (long *)__dynamic_cast(p_1,&Stmt::typeinfo,&IfStmt::typeinfo,0);
          }
          local_d0 = local_1f0;
          if (local_1f0 == (long *)0x0) {
            local_f2 = 1;
            pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,"stmt is not if but is marked as StatementType::If",
                       &local_f1);
            InternalException::InternalException(pIVar6,&local_f0);
            local_f2 = 0;
            __cxa_throw(pIVar6,&InternalException::typeinfo,InternalException::~InternalException);
          }
          (**(code **)(*local_1f0 + 0x50))(local_1f0,parent);
        }
        else {
          SVar3 = Stmt::type(&p_1->super_Stmt);
          if (SVar3 != Block) {
            p_3._6_1_ = 1;
            pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_118,"Internal error",&local_119);
            local_150 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)parent)
            ;
            local_148 = &local_150;
            local_140 = 1;
            std::allocator<kratos::IRNode_*>::allocator
                      ((allocator<kratos::IRNode_*> *)((long)&p_3 + 7));
            __l._M_len = local_140;
            __l._M_array = (iterator)local_148;
            std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                      (&local_138,__l,(allocator<kratos::IRNode_*> *)((long)&p_3 + 7));
            StmtException::StmtException(pSVar5,&local_118,&local_138);
            p_3._6_1_ = 0;
            __cxa_throw(pSVar5,&StmtException::typeinfo,StmtException::~StmtException);
          }
          if (p_1 == (SwitchStmt *)0x0) {
            local_228 = (long *)0x0;
          }
          else {
            local_228 = (long *)__dynamic_cast(p_1,&Stmt::typeinfo,&StmtBlock::typeinfo,0);
          }
          local_160 = local_228;
          if (local_228 == (long *)0x0) {
            pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,
                       "stmt is not block but is marked as StatementType::StatementType::Block",
                       &local_181);
            InternalException::InternalException(pIVar6,&local_180);
            __cxa_throw(pIVar6,&InternalException::typeinfo,InternalException::~InternalException);
          }
          (**(code **)(*local_228 + 0x50))(local_228,parent);
        }
      }
    }
  }
  return;
}

Assistant:

void remove_stmt_from_parent(const std::shared_ptr<Stmt> &stmt) {
    auto *parent = stmt->parent();
    if (!parent) return;
    if (parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
        auto *p = dynamic_cast<Generator *>(parent);
        p->remove_stmt(stmt);
    } else {
        if (parent->ir_node_kind() != IRNodeKind::StmtKind) {
            throw StmtException("Internal error", {stmt.get()});
        }
        auto *p_stmt = dynamic_cast<Stmt *>(parent);
        if (p_stmt->type() == StatementType::Switch) {
            auto *p = dynamic_cast<SwitchStmt *>(p_stmt);
            if (!p)
                throw InternalException(
                    "stmt is not switch but is marked as StatementType::Switch");
            p->remove_stmt(stmt);
        } else if (p_stmt->type() == StatementType::If) {
            auto *p = dynamic_cast<IfStmt *>(p_stmt);
            if (!p) throw InternalException("stmt is not if but is marked as StatementType::If");
            p->remove_stmt(stmt);
        } else {
            if (p_stmt->type() != StatementType::Block) {
                throw StmtException("Internal error", {stmt.get()});
            }
            auto *p = dynamic_cast<StmtBlock *>(p_stmt);
            if (!p)
                throw InternalException(
                    "stmt is not block but is marked as StatementType::StatementType::Block");
            p->remove_stmt(stmt);
        }
    }
}